

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOutput_printTestsEndedWithFailures_Test::testBody
          (TEST_TestOutput_printTestsEndedWithFailures_Test *this)

{
  TestResult *pTVar1;
  TestOutput *pTVar2;
  UtestShell *pUVar3;
  SimpleString *this_00;
  char *pcVar4;
  TestTerminator *pTVar5;
  TEST_TestOutput_printTestsEndedWithFailures_Test *this_local;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestOutput).result;
  (*pTVar1->_vptr_TestResult[0xd])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestOutput).f);
  (*((this->super_TEST_GROUP_CppUTestGroupTestOutput).printer)->_vptr_TestOutput[0x13])();
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestOutput).printer;
  (*pTVar2->_vptr_TestOutput[3])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestOutput).result);
  pUVar3 = UtestShell::getCurrent();
  this_00 = StringBufferTestOutput::getOutput((this->super_TEST_GROUP_CppUTestGroupTestOutput).mock)
  ;
  pcVar4 = SimpleString::asCharString(this_00);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "\nErrors (1 failures, 0 tests, 0 ran, 0 checks, 0 ignored, 0 filtered out, 10 ms)\n\n"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
             ,0x10f,pTVar5);
  return;
}

Assistant:

TEST(TestOutput, printTestsEndedWithFailures)
{
    result->addFailure(*f);
    printer->flush();
    printer->printTestsEnded(*result);
    STRCMP_EQUAL("\nErrors (1 failures, 0 tests, 0 ran, 0 checks, 0 ignored, 0 filtered out, 10 ms)\n\n", mock->getOutput().asCharString());
}